

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,HeapType a,HeapType b)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  BasicHeapType BVar4;
  BasicHeapType BVar5;
  HeapTypeInfo *pHVar6;
  HeapTypeInfo *pHVar7;
  HeapType HVar8;
  bool bVar9;
  HeapType local_30;
  HeapType b_local;
  HeapType a_local;
  
  bVar9 = true;
  if (this == (SubTyper *)a.id) {
    return true;
  }
  local_30.id = a.id;
  b_local.id = (uintptr_t)this;
  bVar2 = HeapType::isShared(&b_local);
  bVar3 = HeapType::isShared(&local_30);
  if (bVar2 != bVar3) {
LAB_00cfa7ca:
    return false;
  }
  if (0x7c < local_30.id) {
switchD_00cfa726_default:
    if (b_local.id < 0x7d) {
      BVar4 = HeapType::getBottom(&local_30);
      return b_local.id == BVar4;
    }
    pHVar6 = getHeapTypeInfo(b_local);
    do {
      pHVar6 = pHVar6->supertype;
      bVar9 = pHVar6 != (HeapTypeInfo *)0x0;
      if (pHVar6 == (HeapTypeInfo *)0x0) {
        return bVar9;
      }
      pHVar7 = getHeapTypeInfo(local_30);
    } while (pHVar6 != pHVar7);
    return bVar9;
  }
  BVar4 = HeapType::getUnsharedTop(&b_local);
  HVar8 = b_local;
  if (b_local.id < 0x7d) {
    BVar5 = HeapType::getBasic(&b_local,Unshared);
    HVar8.id = (uintptr_t)BVar5;
  }
  BVar5 = HeapType::getBasic(&local_30,Unshared);
  switch(BVar5 << 0x1d | BVar5 - ext >> 3) {
  case 0:
    bVar9 = BVar4 == ext;
    break;
  case 1:
    bVar9 = BVar4 == func;
    break;
  case 2:
    bVar9 = BVar4 == cont;
    break;
  case 3:
    bVar9 = BVar4 == any;
    break;
  case 4:
    uVar1 = HVar8.id - 0x30 >> 3;
    if (((HVar8.id << 0x3d | uVar1) < 6) && ((0x27U >> ((uint)uVar1 & 0x1f) & 1) != 0)) {
      return true;
    }
    bVar9 = HeapType::isStruct(&b_local);
    if (bVar9) {
      return true;
    }
    goto LAB_00cfa7bf;
  case 5:
    bVar9 = HVar8.id == 0x58;
    break;
  case 6:
    if (HVar8.id != 0x58) {
      bVar9 = HeapType::isStruct(&b_local);
    }
    break;
  case 7:
    if (HVar8.id == 0x58) {
      return true;
    }
LAB_00cfa7bf:
    bVar9 = HeapType::isArray(&b_local);
    break;
  case ext:
    bVar9 = BVar4 == exn;
    break;
  case 9:
    bVar9 = HVar8.id == 0x60;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    goto LAB_00cfa7ca;
  default:
    goto switchD_00cfa726_default;
  }
  return bVar9;
}

Assistant:

bool SubTyper::isSubType(HeapType a, HeapType b) {
  // See:
  // https://github.com/WebAssembly/function-references/blob/master/proposals/function-references/Overview.md#subtyping
  // https://github.com/WebAssembly/gc/blob/master/proposals/gc/MVP.md#defined-types
  if (a == b) {
    return true;
  }
  if (a.isShared() != b.isShared()) {
    return false;
  }
  if (b.isBasic()) {
    auto aTop = a.getUnsharedTop();
    auto aUnshared = a.isBasic() ? a.getBasic(Unshared) : a;
    switch (b.getBasic(Unshared)) {
      case HeapType::ext:
        return aTop == HeapType::ext;
      case HeapType::func:
        return aTop == HeapType::func;
      case HeapType::cont:
        return aTop == HeapType::cont;
      case HeapType::exn:
        return aTop == HeapType::exn;
      case HeapType::any:
        return aTop == HeapType::any;
      case HeapType::eq:
        return aUnshared == HeapType::i31 || aUnshared == HeapType::none ||
               aUnshared == HeapType::struct_ || aUnshared == HeapType::array ||
               a.isStruct() || a.isArray();
      case HeapType::i31:
        return aUnshared == HeapType::none;
      case HeapType::string:
        return aUnshared == HeapType::noext;
      case HeapType::struct_:
        return aUnshared == HeapType::none || a.isStruct();
      case HeapType::array:
        return aUnshared == HeapType::none || a.isArray();
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        return false;
    }
  }
  if (a.isBasic()) {
    // Basic HeapTypes are only subtypes of compound HeapTypes if they are
    // bottom types.
    return a == b.getBottom();
  }
  // Subtyping must be declared rather than derived from structure, so we will
  // not recurse. TODO: optimize this search with some form of caching.
  HeapTypeInfo* curr = getHeapTypeInfo(a);
  while ((curr = curr->supertype)) {
    if (curr == getHeapTypeInfo(b)) {
      return true;
    }
  }
  return false;
}